

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  undefined1 local_258 [8];
  LodePNGState state;
  uint error;
  LodePNGColorType colortype_local;
  size_t insize_local;
  uchar *in_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  state._540_4_ = colortype;
  lodepng_state_init((LodePNGState *)local_258);
  state.encoder.text_compression = state._540_4_;
  state.encoder._84_4_ = bitdepth;
  state.decoder.ignore_end = 0;
  state.decoder.color_convert = 0;
  state.error = lodepng_decode(out,w,h,(LodePNGState *)local_258,in,insize);
  lodepng_state_cleanup((LodePNGState *)local_258);
  return state.error;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  /*disable reading things that this function doesn't output*/
  state.decoder.read_text_chunks = 0;
  state.decoder.remember_unknown_chunks = 0;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}